

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort.cpp
# Opt level: O0

void merge_3way(uchar **from0,size_t n0,uchar **from1,size_t n1,uchar **from2,size_t n2,
               uchar **result)

{
  int iVar1;
  int iVar2;
  uchar **ppuVar3;
  int cmp20;
  int cmp10;
  int cmp01_3;
  int cmp01_2;
  int cmp02_2;
  int cmp02_1;
  int cmp01_1;
  int cmpac_3;
  int cmpab_3;
  int cmpac_2;
  int cmpab_2;
  int cmpac_1;
  int cmpab_1;
  int cmpac;
  int cmpab;
  int cmp02;
  int cmp12;
  int cmp01;
  uchar *key2;
  uchar *key1;
  uchar *key0;
  size_t n2_local;
  uchar **from2_local;
  size_t n1_local;
  uchar **from1_local;
  size_t n0_local;
  uchar **from0_local;
  
  key1 = *from0;
  key2 = *from1;
  _cmp12 = *from2;
  iVar1 = cmp(key1,key2);
  iVar2 = cmp(key2,_cmp12);
  key0 = (uchar *)n2;
  n2_local = (size_t)from2;
  from2_local = (uchar **)n1;
  n1_local = (size_t)from1;
  from1_local = (uchar **)n0;
  n0_local = (size_t)from0;
  if (iVar1 < 0) {
    if (-1 < iVar2) {
      if (iVar2 == 0) goto LAB_00269dab;
      iVar1 = cmp(key1,_cmp12);
      if (iVar1 < 1) goto LAB_00269d06;
      goto LAB_00269b5b;
    }
  }
  else {
    if (iVar1 != 0) {
      if (0 < iVar2) goto LAB_00269bed;
      if (iVar2 == 0) goto LAB_00269acc;
      iVar1 = cmp(key1,_cmp12);
      ppuVar3 = result;
      if (iVar1 < 0) goto LAB_00269a3a;
joined_r0x00269a2e:
      result = ppuVar3;
      if (iVar1 == 0) goto LAB_00269e18;
      goto LAB_00269acc;
    }
    if (-1 < iVar2) {
      if (iVar2 == 0) goto LAB_00269dab;
      goto LAB_00269e8d;
    }
  }
  do {
    do {
      ppuVar3 = result + 1;
      *result = key1;
      from1_local = (uchar **)((long)from1_local - 1);
      result = ppuVar3;
      if (from1_local == (uchar **)0x0) {
LAB_00269f11:
        merge_2way((uchar **)n1_local,(size_t)from2_local,(uchar **)n2_local,(size_t)key0,result);
        return;
      }
      n0_local = n0_local + 8;
      key1 = *(uchar **)n0_local;
      iVar1 = cmp(key1,key2);
    } while (iVar1 < 1);
    iVar1 = cmp(key1,_cmp12);
    if (-1 < iVar1) goto joined_r0x00269a2e;
LAB_00269a3a:
    do {
      ppuVar3 = result + 1;
      *result = key2;
      from2_local = (uchar **)((long)from2_local + -1);
      result = ppuVar3;
      if (from2_local == (uchar **)0x0) {
LAB_00269f57:
        merge_2way((uchar **)n0_local,(size_t)from1_local,(uchar **)n2_local,(size_t)key0,result);
        return;
      }
      n1_local = n1_local + 8;
      key2 = *(uchar **)n1_local;
      iVar1 = cmp(key2,key1);
    } while (iVar1 < 0);
    if ((iVar1 != 0) && (iVar1 = cmp(key2,_cmp12), -1 < iVar1)) {
      if (iVar1 != 0) goto LAB_00269d06;
LAB_00269dab:
      do {
        do {
          ppuVar3 = result + 1;
          *result = key1;
          from1_local = (uchar **)((long)from1_local + -1);
          result = ppuVar3;
          if (from1_local == (uchar **)0x0) goto LAB_00269f11;
          n0_local = n0_local + 8;
          key1 = *(uchar **)n0_local;
          iVar1 = cmp(*(void **)n0_local,*(void **)n1_local);
        } while (iVar1 < 1);
LAB_00269acc:
        while( true ) {
          do {
            ppuVar3 = result + 1;
            *result = key2;
            from2_local = (uchar **)((long)from2_local + -1);
            result = ppuVar3;
            if (from2_local == (uchar **)0x0) goto LAB_00269f57;
            n1_local = n1_local + 8;
            key2 = *(uchar **)n1_local;
            iVar1 = cmp(key2,_cmp12);
          } while ((iVar1 < 0) || (iVar1 == 0));
          iVar1 = cmp(key2,key1);
          if (-1 < iVar1) break;
LAB_00269bed:
          while( true ) {
            do {
              ppuVar3 = result + 1;
              *result = _cmp12;
              key0 = key0 + -1;
              result = ppuVar3;
              if (key0 == (uchar *)0x0) goto LAB_00269f9a;
              n2_local = n2_local + 8;
              _cmp12 = *(uchar **)n2_local;
              iVar1 = cmp(_cmp12,key2);
            } while (iVar1 < 0);
            if ((iVar1 == 0) || (iVar1 = cmp(_cmp12,key1), iVar1 < 0)) break;
            if (iVar1 != 0) goto LAB_00269a3a;
LAB_00269e18:
            do {
              ppuVar3 = result + 1;
              *result = key2;
              from2_local = (uchar **)((long)from2_local + -1);
              result = ppuVar3;
              if (from2_local == (uchar **)0x0) goto LAB_00269f57;
              n1_local = n1_local + 8;
              key2 = *(uchar **)n1_local;
              iVar1 = cmp(key2,key1);
            } while (iVar1 < 0);
            if (iVar1 == 0) goto LAB_00269dab;
LAB_00269d06:
            while( true ) {
              do {
                ppuVar3 = result + 1;
                *result = key1;
                from1_local = (uchar **)((long)from1_local + -1);
                result = ppuVar3;
                if (from1_local == (uchar **)0x0) goto LAB_00269f11;
                n0_local = n0_local + 8;
                key1 = *(uchar **)n0_local;
                iVar1 = cmp(key1,_cmp12);
              } while (iVar1 < 1);
              iVar1 = cmp(key1,key2);
              if (-1 < iVar1) break;
LAB_00269b5b:
              do {
                ppuVar3 = result + 1;
                *result = _cmp12;
                key0 = key0 + -1;
                result = ppuVar3;
                if (key0 == (uchar *)0x0) goto LAB_00269f9a;
                n2_local = n2_local + 8;
                _cmp12 = *(uchar **)n2_local;
                iVar1 = cmp(_cmp12,key1);
              } while (iVar1 < 0);
              if ((iVar1 != 0) && (iVar1 = cmp(_cmp12,key2), -1 < iVar1)) goto joined_r0x00269ef6;
            }
            if (iVar1 == 0) goto LAB_00269e8d;
          }
        }
        if (iVar1 != 0) goto LAB_00269b5b;
LAB_00269e8d:
        do {
          ppuVar3 = result + 1;
          *result = _cmp12;
          key0 = key0 + -1;
          result = ppuVar3;
          if (key0 == (uchar *)0x0) {
LAB_00269f9a:
            merge_2way((uchar **)n0_local,(size_t)from1_local,(uchar **)n1_local,(size_t)from2_local
                       ,result);
            return;
          }
          n2_local = n2_local + 8;
          _cmp12 = *(uchar **)n2_local;
          iVar1 = cmp(_cmp12,key1);
        } while (iVar1 < 0);
joined_r0x00269ef6:
        result = ppuVar3;
      } while (iVar1 == 0);
    }
  } while( true );
}

Assistant:

static void
merge_3way(unsigned char** restrict from0, size_t n0,
           unsigned char** restrict from1, size_t n1,
           unsigned char** restrict from2, size_t n2,
           unsigned char** restrict result)
{
	debug()<<__func__<<"(), n0="<<n0<<", n1="<<n1<<", n2="<<n2<<"\n";
	unsigned char* key0 = *from0;
	unsigned char* key1 = *from1;
	unsigned char* key2 = *from2;
	const int cmp01 = cmp(key0, key1);
	const int cmp12 = cmp(key1, key2);
	int cmp02 = 0;
	if (cmp01 < 0) {
		if (cmp12 < 0)  { goto state0lt1lt2; }
		if (cmp12 == 0) { goto state0lt1eq2; }
		cmp02 = cmp(key0, key2);
		if (cmp02 <= 0) { goto state0lt2lt1; }
		goto state2lt0lt1;
	}
	if (cmp01 == 0) {
		if (cmp12 < 0)  { goto state0lt1lt2; }
		if (cmp12 == 0) { goto state0lt1eq2; }
		goto state2lt0eq1;
	}
	if (cmp12 > 0)  { goto state2lt1lt0; }
	if (cmp12 == 0) { goto state1lt2lt0; }
	cmp02 = cmp(key0, key2);
	if (cmp02 < 0)  { goto state1lt0lt2; }
	if (cmp02 == 0) { goto state1lt0eq2; }
	goto state1lt2lt0;

#define StrictCase(a,b,c)                                                      \
        state##a##lt##b##lt##c:                                                \
        {                                                                      \
                *result++ = key##a;                                            \
                if (--n##a == 0) goto finish##a;                               \
                ++from##a;                                                     \
                key##a = *from##a;                                             \
                const int cmpab = cmp(key##a, key##b);                         \
                if (cmpab < 0)  goto state##a##lt##b##lt##c;                   \
                if (cmpab == 0) goto state##a##eq##b##lt##c;                   \
                const int cmpac = cmp(key##a, key##c);                         \
                if (cmpac < 0)  goto state##b##lt##a##lt##c;                   \
                if (cmpac == 0) goto state##b##lt##a##eq##c;                   \
                goto state##b##lt##c##lt##a;                                   \
        }
        StrictCase(1, 0, 2)
        StrictCase(1, 2, 0)
        StrictCase(2, 0, 1)
        StrictCase(2, 1, 0)
#undef StrictCase

state0lt1lt2:
{
	*result++ = key0;
	if (--n0 == 0) goto finish0;
	++from0;
	key0 = *from0;
	const int cmp01 = cmp(key0, key1);
	if (cmp01 <= 0) goto state0lt1lt2;
	const int cmp02 = cmp(key0, key2);
	if (cmp02 < 0)  goto state1lt0lt2;
	if (cmp02 == 0) goto state1lt0eq2;
	goto state1lt2lt0;
}
state0lt2lt1:
{
	*result++ = key0;
	if (--n0 == 0) goto finish0;
	++from0;
	key0 = *from0;
	const int cmp02 = cmp(key0, key2);
	if (cmp02 <= 0) goto state0lt2lt1;
	const int cmp01 = cmp(key0, key1);
	if (cmp01 < 0)  goto state2lt0lt1;
	if (cmp01 == 0) goto state2lt0eq1;
	goto state2lt1lt0;
}

// No advantage from equality of first two strings.
state0eq1lt2: goto state0lt1lt2;
state0eq2lt1: goto state0lt2lt1;
state1eq2lt0: goto state1lt2lt0;

// Fix order.
state2eq0lt1: goto state0eq2lt1;
state1eq0lt2: goto state0eq1lt2;
state2eq1lt0: goto state1eq2lt0;

state0lt1eq2:
{
	*result++ = key0;
	if (--n0 == 0) goto finish0;
	++from0;
	key0 = *from0;
	const int cmp01 = cmp(*from0, *from1);
	if (cmp01 <= 0) goto state0lt1eq2;
	goto state1lt2lt0;
}
state1lt0eq2:
{
	*result++ = key1;
	if (--n1 == 0) goto finish1;
	++from1;
	key1 = *from1;
	const int cmp10 = cmp(key1, key0);
	if (cmp10 < 0)  goto state1lt0eq2;
	if (cmp10 == 0) goto state0lt1eq2;
	goto state0lt2lt1;
}
state2lt0eq1:
{
	*result++ = key2;
	if (--n2 == 0) goto finish2;
	++from2;
	key2 = *from2;
	const int cmp20 = cmp(key2, key0);
	if (cmp20 < 0)  goto state2lt0eq1;
	if (cmp20 == 0) goto state0lt1eq2;
	goto state0lt1lt2;
}
state0lt2eq1: goto state0lt1eq2;
state1lt2eq0: goto state1lt0eq2;
state2lt1eq0: goto state2lt0eq1;

finish0:
	assert(n0 == 0);
	merge_2way(from1, n1, from2, n2, result);
	return;
finish1:
	assert(n1 == 0);
	merge_2way(from0, n0, from2, n2, result);
	return;
finish2:
	assert(n2 == 0);
	merge_2way(from0, n0, from1, n1, result);
	return;
}